

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O2

void __thiscall sc_core::vcd_trace_file::cycle(vcd_trace_file *this,bool this_is_a_delta_cycle)

{
  pointer ppvVar1;
  vcd_trace *pvVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  sc_time *psVar7;
  uint64 uVar8;
  pointer ppvVar9;
  unit_type extraout_RDX;
  unit_type tu;
  unit_type extraout_RDX_00;
  unit_type tu_00;
  undefined7 in_register_00000031;
  int i;
  long lVar10;
  unit_type now_units_low;
  string local_1e0;
  unit_type now_units_high;
  stringstream ss;
  ostream local_1a8 [376];
  
  if ((((int)CONCAT71(in_register_00000031,this_is_a_delta_cycle) == 0) ||
      ((this->super_sc_trace_file_base).trace_delta_cycles_ != false)) &&
     (bVar3 = sc_trace_file_base::initialize(&this->super_sc_trace_file_base), !bVar3)) {
    bVar3 = get_time_stamp(this,&now_units_high,&now_units_low);
    bVar4 = sc_trace_file_base::has_low_units(&this->super_sc_trace_file_base);
    tu_00 = extraout_RDX;
    if ((!bVar4) && (now_units_low != 0)) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar6 = std::operator<<(local_1a8,"\n\tCurrent kernel time is ");
      psVar7 = sc_time_stamp();
      sc_time::print(psVar7,poVar6);
      poVar6 = std::operator<<(local_1a8,"\n\tVCD trace time unit is ");
      sc_trace_file_base::fs_unit_to_str_abi_cxx11_
                (&local_1e0,(sc_trace_file_base *)(this->super_sc_trace_file_base).trace_unit_fs,tu)
      ;
      std::operator<<(poVar6,(string *)&local_1e0);
      std::__cxx11::string::_M_dispose();
      std::operator<<(local_1a8,
                      "\n\tUse \'tracefile->set_time_unit(double, sc_time_unit);\' to increase the time resolution."
                     );
      std::__cxx11::stringbuf::str();
      sc_report_handler::report
                (SC_WARNING,"current kernel time is not representable in VCD time units",
                 local_1e0._M_dataplus._M_p,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/tracing/sc_vcd_trace.cpp"
                 ,0x7e4);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      tu_00 = extraout_RDX_00;
    }
    if ((this->super_sc_trace_file_base).trace_delta_cycles_ == true) {
      if (!this_is_a_delta_cycle) {
        if (!bVar3) {
          return;
        }
        this->previous_time_units_high = now_units_high;
        this->previous_time_units_low = now_units_low;
        return;
      }
      if (cycle(bool)::warned == '\0') {
        sc_trace_file_base::fs_unit_to_str_abi_cxx11_
                  ((string *)&ss,
                   (sc_trace_file_base *)(this->super_sc_trace_file_base).trace_unit_fs,tu_00);
        sc_report_handler::report
                  (SC_INFO,"VCD delta cycle tracing with pseudo timesteps (1 unit)",_ss,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/tracing/sc_vcd_trace.cpp"
                   ,0x7ed);
        std::__cxx11::string::_M_dispose();
        cycle(bool)::warned = '\x01';
      }
      uVar8 = sc_delta_count_at_current_time();
      if (!bVar3 && uVar8 == 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar6 = std::operator<<(local_1a8,
                                 "\n\tThis can occur when delta cycle tracing is activated.");
        poVar6 = std::operator<<(poVar6,"\n\tSome delta cycles at ");
        psVar7 = sc_time_stamp();
        sc_time::print(psVar7,poVar6);
        poVar6 = std::operator<<(poVar6," are not shown in vcd.");
        std::operator<<(poVar6,
                        "\n\tUse \'tracefile->set_time_unit(double, sc_time_unit);\' to increase the time resolution."
                       );
        std::__cxx11::stringbuf::str();
        sc_report_handler::report
                  (SC_WARNING,"tracing cycle with duplicate or reversed time detected",
                   local_1e0._M_dataplus._M_p,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/tracing/sc_vcd_trace.cpp"
                   ,0x7f7);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        return;
      }
    }
    ppvVar1 = (this->traces).
              super__Vector_base<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    bVar3 = false;
    ppvVar9 = ppvVar1;
    for (lVar10 = 0;
        lVar10 < (int)((ulong)((long)(this->traces).
                                     super__Vector_base<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar9) >>
                      3); lVar10 = lVar10 + 1) {
      pvVar2 = ppvVar1[lVar10];
      iVar5 = (*pvVar2->_vptr_vcd_trace[2])(pvVar2);
      if ((char)iVar5 != '\0') {
        if (!bVar3) {
          print_time_stamp(this,now_units_high,now_units_low);
          bVar3 = true;
        }
        (**pvVar2->_vptr_vcd_trace)(pvVar2,(this->super_sc_trace_file_base).fp);
        fputc(10,(FILE *)(this->super_sc_trace_file_base).fp);
      }
      ppvVar9 = (this->traces).
                super__Vector_base<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    }
    if (bVar3) {
      fputc(10,(FILE *)(this->super_sc_trace_file_base).fp);
    }
  }
  return;
}

Assistant:

void
vcd_trace_file::cycle(bool this_is_a_delta_cycle)
{
    // Trace delta cycles only when enabled
    if (!delta_cycles() && this_is_a_delta_cycle) return;

    // Check for initialization
    if( initialize() )
        return;

    unit_type now_units_high, now_units_low;

    bool time_advanced = get_time_stamp(now_units_high, now_units_low);

    if (!has_low_units() && (now_units_low != 0)) {
        std::stringstream ss;
        ss << "\n\tCurrent kernel time is " << sc_time_stamp();
        ss << "\n\tVCD trace time unit is " << fs_unit_to_str(trace_unit_fs);
        ss << "\n\tUse 'tracefile->set_time_unit(double, sc_time_unit);' to increase the time resolution.";
        SC_REPORT_WARNING( SC_ID_TRACING_VCD_TIME_RESOLUTION_, ss.str().c_str() );
    }

    if (delta_cycles()) {

        if(this_is_a_delta_cycle) {
            static bool warned = false;
            if(!warned){
                SC_REPORT_INFO( SC_ID_TRACING_VCD_DELTA_CYCLE_
                , fs_unit_to_str(trace_unit_fs).c_str() );
                warned = true;
            }

            if (sc_delta_count_at_current_time() == 0) {
                if(!time_advanced) {
                    std::stringstream ss;
                    ss <<"\n\tThis can occur when delta cycle tracing is activated."
                       <<"\n\tSome delta cycles at " << sc_time_stamp() << " are not shown in vcd."
                       <<"\n\tUse 'tracefile->set_time_unit(double, sc_time_unit);' to increase the time resolution.";
                    SC_REPORT_WARNING( SC_ID_TRACING_REVERSED_TIME_, ss.str().c_str() );

                    return;
                }
            }
        }

        if (!this_is_a_delta_cycle) {
            if (time_advanced) {
                previous_time_units_high = now_units_high;
                previous_time_units_low = now_units_low;
            }
            // Value updates can't happen during timed notification
            // so it is safe to skip printing
            return;
        }
    }

    // Now do the actual printing
    bool time_printed = false;
    vcd_trace* const* const l_traces = &traces[0];
    for (int i = 0; i < (int)traces.size(); i++) {
        vcd_trace* t = l_traces[i];
        if(t->changed()) {
            if(!time_printed){
                print_time_stamp(now_units_high, now_units_low);

                time_printed = true;
            }

            // Write the variable
            t->write(fp);
            std::fputc('\n', fp);
        }
    }
    // Put another newline after all values are printed
    if(time_printed) std::fputc('\n', fp);
}